

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::MultiNode<QString,_QCss::StyleRule>::~MultiNode
          (MultiNode<QString,_QCss::StyleRule> *this)

{
  void *in_RSI;
  
  if (*(MultiNodeChain<QCss::StyleRule> **)(this + 0x18) != (MultiNodeChain<QCss::StyleRule> *)0x0)
  {
    MultiNodeChain<QCss::StyleRule>::free(*(MultiNodeChain<QCss::StyleRule> **)(this + 0x18),in_RSI)
    ;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

~MultiNode()
    {
        if (value)
            value->free();
    }